

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddqDn<(moira::Instr)121,(moira::Mode)0,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  
  uVar4 = 8;
  if ((op >> 9 & 7) != 0) {
    uVar4 = op >> 9 & 7;
  }
  pcVar6 = "subq";
  if (str->upper != false) {
    pcVar6 = "SUBQ";
  }
  cVar5 = *pcVar6;
  while (cVar5 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar5;
    cVar5 = *pcVar6;
  }
  if (str->upper == false) {
    cVar5 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = ".b"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else {
    cVar5 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = ".B"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  iVar1 = (this->tab).raw;
  s = &str->ptr;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pcVar6 = *s;
  *s = pcVar6 + 1;
  *pcVar6 = '#';
  sprintd(s,(ulong)uVar4);
  cVar5 = ',';
  lVar7 = 0;
  do {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = cVar5;
    cVar5 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pcVar6 = *s;
  *s = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar3 = (byte *)*s;
  *s = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  return;
}

Assistant:

void
Moira::dasmAddqDn(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd ( ____xxx_________(op) );
    auto dst = Dn  ( _____________xxx(op) );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}